

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_psbt.cpp
# Opt level: O1

void cfd::core::MergePsbtInputItem
               (wally_psbt_input *psbt,wally_psbt_input *psbt_dest,bool ignore_duplicate_error,
               string *item_name)

{
  pointer pcVar1;
  uint32_t uVar2;
  wally_tx *p;
  wally_tx_output *p_00;
  wally_tx_output *pwVar3;
  uint64_t uVar4;
  uint64_t uVar5;
  size_t sVar6;
  size_t sVar7;
  bool bVar8;
  CfdException *pCVar9;
  long *plVar10;
  uint8_t *puVar11;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar12;
  undefined1 ignore_duplicate_error_00;
  string field_name;
  int ret;
  undefined1 local_e0 [36];
  int local_bc;
  uchar *local_b8;
  undefined1 local_b0 [32];
  undefined1 local_90 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_80;
  size_t local_70;
  uint8_t *local_68;
  size_t local_60;
  uint8_t *local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  p = psbt_dest->utxo;
  if (p != (wally_tx *)0x0) {
    if (psbt->utxo == (wally_tx *)0x0) {
      local_bc = wally_psbt_input_set_utxo(psbt,p);
      if (local_bc != 0) {
        local_b0._0_8_ = "cfdcore_psbt.cpp";
        local_b0._8_4_ = 0x1ca;
        local_b0._16_8_ = "MergePsbtInputItem";
        logger::log<int&>((CfdSourceLocation *)local_b0,kCfdLogLevelWarning,
                          "wally_psbt_input_set_utxo NG[{}]",&local_bc);
        pCVar9 = (CfdException *)__cxa_allocate_exception(0x30);
        local_b0._0_8_ = local_b0 + 0x10;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_b0,"psbt set utxo error.","");
        CfdException::CfdException(pCVar9,kCfdIllegalArgumentError,(string *)local_b0);
        __cxa_throw(pCVar9,&CfdException::typeinfo,CfdException::~CfdException);
      }
    }
    else {
      bVar8 = MatchWallyTx(psbt->utxo,p);
      if (!bVar8 && !ignore_duplicate_error) {
        local_b0._0_8_ = "cfdcore_psbt.cpp";
        local_b0._8_4_ = 0x1d2;
        local_b0._16_8_ = "MergePsbtInputItem";
        logger::log<>((CfdSourceLocation *)local_b0,kCfdLogLevelWarning,
                      "psbt txin utxo already exist.");
        pCVar9 = (CfdException *)__cxa_allocate_exception(0x30);
        local_b0._0_8_ = local_b0 + 0x10;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_b0,"psbt txin utxo duplicated error.","");
        CfdException::CfdException(pCVar9,kCfdIllegalArgumentError,(string *)local_b0);
        __cxa_throw(pCVar9,&CfdException::typeinfo,CfdException::~CfdException);
      }
    }
  }
  p_00 = psbt_dest->witness_utxo;
  ignore_duplicate_error_00 = ignore_duplicate_error;
  if (p_00 != (wally_tx_output *)0x0) {
    pwVar3 = psbt->witness_utxo;
    if (pwVar3 == (wally_tx_output *)0x0) {
      local_bc = wally_psbt_input_set_witness_utxo(psbt,p_00);
      if (local_bc != 0) {
        local_b0._0_8_ = "cfdcore_psbt.cpp";
        local_b0._8_4_ = 0x1db;
        local_b0._16_8_ = "MergePsbtInputItem";
        logger::log<int&>((CfdSourceLocation *)local_b0,kCfdLogLevelWarning,
                          "wally_psbt_input_set_witness_utxo NG[{}]",&local_bc);
        pCVar9 = (CfdException *)__cxa_allocate_exception(0x30);
        local_b0._0_8_ = local_b0 + 0x10;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_b0,"psbt set witness utxo error.","");
        CfdException::CfdException(pCVar9,kCfdIllegalArgumentError,(string *)local_b0);
        __cxa_throw(pCVar9,&CfdException::typeinfo,CfdException::~CfdException);
      }
    }
    else {
      local_b8 = (uchar *)CONCAT44(local_b8._4_4_,(uint)ignore_duplicate_error);
      uVar4 = pwVar3->satoshi;
      uVar5 = p_00->satoshi;
      if (uVar4 == uVar5) {
        local_58 = pwVar3->script;
        local_60 = pwVar3->script_len;
        local_68 = p_00->script;
        local_70 = p_00->script_len;
        local_b0._0_8_ = local_b0 + 0x10;
        ::std::__cxx11::string::_M_construct<char_const*>((string *)local_b0,"scriptPubkey","");
        bVar8 = ComparePsbtData(local_58,local_60,local_68,local_70,item_name,(string *)local_b0,
                                SUB81(local_b8,0));
      }
      else {
        bVar8 = false;
      }
      ignore_duplicate_error_00 = local_b8._0_1_;
      if ((uVar4 == uVar5) && ((undefined1 *)local_b0._0_8_ != local_b0 + 0x10)) {
        operator_delete((void *)local_b0._0_8_);
      }
      if (bVar8 == false && !ignore_duplicate_error) {
        local_e0._0_8_ = "cfdcore_psbt.cpp";
        local_e0._8_4_ = 0x1ea;
        local_e0._16_8_ = "MergePsbtInputItem";
        logger::log<>((CfdSourceLocation *)local_e0,kCfdLogLevelWarning,
                      "psbt txin witness utxo already exist.");
        pCVar9 = (CfdException *)__cxa_allocate_exception(0x30);
        local_e0._0_8_ = local_e0 + 0x10;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_e0,"psbt txin witness utxo duplicated error.","");
        CfdException::CfdException(pCVar9,kCfdIllegalArgumentError,(string *)local_e0);
        __cxa_throw(pCVar9,&CfdException::typeinfo,CfdException::~CfdException);
      }
    }
  }
  uVar2 = psbt_dest->sighash;
  if (uVar2 != 0) {
    if (psbt->sighash == 0) {
      psbt->sighash = uVar2;
    }
    else if (psbt->sighash != uVar2 && !ignore_duplicate_error) {
      local_e0._0_8_ = local_e0 + 0x10;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_e0,"txin sighashtype","");
      local_90._0_8_ = "cfdcore_psbt.cpp";
      local_90._8_4_ = 0x1f9;
      local_80._M_allocated_capacity = 0x59b5b7;
      logger::log<std::__cxx11::string&>
                ((CfdSourceLocation *)local_90,kCfdLogLevelWarning,"psbt {} already exist.",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_e0);
      pCVar9 = (CfdException *)__cxa_allocate_exception(0x30);
      ::std::operator+(&local_50,"psbt ",
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_e0
                      );
      plVar10 = (long *)::std::__cxx11::string::append((char *)&local_50);
      local_90._0_8_ = *plVar10;
      paVar12 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)(plVar10 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_90._0_8_ == paVar12) {
        local_80._M_allocated_capacity = paVar12->_M_allocated_capacity;
        local_80._8_8_ = plVar10[3];
        local_90._0_8_ = &local_80;
      }
      else {
        local_80._M_allocated_capacity = paVar12->_M_allocated_capacity;
      }
      local_90._8_8_ = plVar10[1];
      *plVar10 = (long)paVar12;
      plVar10[1] = 0;
      *(undefined1 *)(plVar10 + 2) = 0;
      CfdException::CfdException(pCVar9,kCfdIllegalArgumentError,(string *)local_90);
      __cxa_throw(pCVar9,&CfdException::typeinfo,CfdException::~CfdException);
    }
  }
  sVar6 = psbt_dest->redeem_script_len;
  if (sVar6 != 0) {
    sVar7 = psbt->redeem_script_len;
    if (sVar7 == 0) {
      puVar11 = AllocWallyBuffer(psbt_dest->redeem_script,sVar6);
      psbt->redeem_script = puVar11;
      psbt->redeem_script_len = psbt_dest->redeem_script_len;
    }
    else {
      puVar11 = psbt->redeem_script;
      local_b8 = psbt_dest->redeem_script;
      local_e0._0_8_ = local_e0 + 0x10;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_e0,"txin redeem script","");
      local_90._0_8_ = &local_80;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_90,"");
      ComparePsbtData(puVar11,sVar7,local_b8,sVar6,(string *)local_e0,(string *)local_90,
                      (bool)ignore_duplicate_error_00);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_90._0_8_ != &local_80) {
        operator_delete((void *)local_90._0_8_);
      }
      if ((undefined1 *)local_e0._0_8_ != local_e0 + 0x10) {
        operator_delete((void *)local_e0._0_8_);
      }
    }
  }
  sVar6 = psbt_dest->witness_script_len;
  if (sVar6 != 0) {
    sVar7 = psbt->witness_script_len;
    if (sVar7 == 0) {
      puVar11 = AllocWallyBuffer(psbt_dest->witness_script,sVar6);
      psbt->witness_script = puVar11;
      psbt->witness_script_len = psbt_dest->witness_script_len;
    }
    else {
      puVar11 = psbt->witness_script;
      local_b8 = psbt_dest->witness_script;
      local_e0._0_8_ = local_e0 + 0x10;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_e0,"txin witness script","")
      ;
      local_90._0_8_ = &local_80;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_90,"");
      ComparePsbtData(puVar11,sVar7,local_b8,sVar6,(string *)local_e0,(string *)local_90,
                      (bool)ignore_duplicate_error_00);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_90._0_8_ != &local_80) {
        operator_delete((void *)local_90._0_8_);
      }
      if ((undefined1 *)local_e0._0_8_ != local_e0 + 0x10) {
        operator_delete((void *)local_e0._0_8_);
      }
    }
  }
  pcVar1 = local_e0 + 0x10;
  local_e0._0_8_ = pcVar1;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)local_e0,"txin keypaths","");
  MergeWallyMap(&psbt->keypaths,&psbt_dest->keypaths,(string *)local_e0,
                (bool)ignore_duplicate_error_00);
  if ((pointer)local_e0._0_8_ != pcVar1) {
    operator_delete((void *)local_e0._0_8_);
  }
  local_e0._0_8_ = pcVar1;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)local_e0,"txin signatures","");
  MergeWallyMap(&psbt->signatures,&psbt_dest->signatures,(string *)local_e0,
                (bool)ignore_duplicate_error_00);
  if ((pointer)local_e0._0_8_ != pcVar1) {
    operator_delete((void *)local_e0._0_8_);
  }
  local_e0._0_8_ = pcVar1;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)local_e0,"txin unknowns","");
  MergeWallyMap(&psbt->unknowns,&psbt_dest->unknowns,(string *)local_e0,
                (bool)ignore_duplicate_error_00);
  if ((pointer)local_e0._0_8_ != pcVar1) {
    operator_delete((void *)local_e0._0_8_);
  }
  return;
}

Assistant:

void MergePsbtInputItem(
    struct wally_psbt_input *psbt, const struct wally_psbt_input *psbt_dest,
    bool ignore_duplicate_error, const std::string &item_name) {
  int ret;
  if (psbt_dest->utxo != nullptr) {
    if (psbt->utxo == nullptr) {
      ret = wally_psbt_input_set_utxo(psbt, psbt_dest->utxo);
      if (ret != WALLY_OK) {
        warn(CFD_LOG_SOURCE, "wally_psbt_input_set_utxo NG[{}]", ret);
        throw CfdException(kCfdIllegalArgumentError, "psbt set utxo error.");
      }
    } else if (MatchWallyTx(psbt->utxo, psbt_dest->utxo)) {
      // match
    } else if (ignore_duplicate_error) {
      // do nothing
    } else {
      warn(CFD_LOG_SOURCE, "psbt txin utxo already exist.");
      throw CfdException(
          kCfdIllegalArgumentError, "psbt txin utxo duplicated error.");
    }
  }
  if (psbt_dest->witness_utxo != nullptr) {
    if (psbt->witness_utxo == nullptr) {
      ret = wally_psbt_input_set_witness_utxo(psbt, psbt_dest->witness_utxo);
      if (ret != WALLY_OK) {
        warn(CFD_LOG_SOURCE, "wally_psbt_input_set_witness_utxo NG[{}]", ret);
        throw CfdException(
            kCfdIllegalArgumentError, "psbt set witness utxo error.");
      }
    } else if (
        (psbt->witness_utxo->satoshi == psbt_dest->witness_utxo->satoshi) &&
        ComparePsbtData(
            psbt->witness_utxo->script, psbt->witness_utxo->script_len,
            psbt_dest->witness_utxo->script,
            psbt_dest->witness_utxo->script_len, item_name, "scriptPubkey",
            ignore_duplicate_error)) {
      // match
    } else if (ignore_duplicate_error) {
      // do nothing
    } else {
      warn(CFD_LOG_SOURCE, "psbt txin witness utxo already exist.");
      throw CfdException(
          kCfdIllegalArgumentError,
          "psbt txin witness utxo duplicated error.");
    }
  }
  if (psbt_dest->sighash > 0) {
    if (psbt->sighash == 0) {
      psbt->sighash = psbt_dest->sighash;
    } else if (psbt->sighash == psbt_dest->sighash) {
      // match
    } else if (ignore_duplicate_error) {
      // do nothing
    } else {
      std::string field_name = "txin sighashtype";
      warn(CFD_LOG_SOURCE, "psbt {} already exist.", field_name);
      throw CfdException(
          kCfdIllegalArgumentError,
          "psbt " + field_name + " duplicated error.");
    }
  }
  if (psbt_dest->redeem_script_len > 0) {
    if (psbt->redeem_script_len == 0) {
      psbt->redeem_script = AllocWallyBuffer(
          psbt_dest->redeem_script, psbt_dest->redeem_script_len);
      psbt->redeem_script_len = psbt_dest->redeem_script_len;
    } else {
      ComparePsbtData(
          psbt->redeem_script, psbt->redeem_script_len,
          psbt_dest->redeem_script, psbt_dest->redeem_script_len,
          "txin redeem script", "", ignore_duplicate_error);
    }
  }
  if (psbt_dest->witness_script_len > 0) {
    if (psbt->witness_script_len == 0) {
      psbt->witness_script = AllocWallyBuffer(
          psbt_dest->witness_script, psbt_dest->witness_script_len);
      psbt->witness_script_len = psbt_dest->witness_script_len;
    } else {
      ComparePsbtData(
          psbt->witness_script, psbt->witness_script_len,
          psbt_dest->witness_script, psbt_dest->witness_script_len,
          "txin witness script", "", ignore_duplicate_error);
    }
  }
  MergeWallyMap(
      &psbt->keypaths, &psbt_dest->keypaths, "txin keypaths",
      ignore_duplicate_error);
  MergeWallyMap(
      &psbt->signatures, &psbt_dest->signatures, "txin signatures",
      ignore_duplicate_error);
  MergeWallyMap(
      &psbt->unknowns, &psbt_dest->unknowns, "txin unknowns",
      ignore_duplicate_error);
}